

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.cpp
# Opt level: O2

unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_> __thiscall
verilogAST::Transformer::visit
          (Transformer *this,
          unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_> *node)

{
  long *plVar1;
  undefined8 *puVar2;
  pointer ppVar3;
  long lVar4;
  long *in_RDX;
  long lVar5;
  pointer *__ptr;
  undefined8 *puVar6;
  vector<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
  new_outer_dims;
  _Head_base<0UL,_verilogAST::Expression_*,_false> local_a8;
  _Head_base<0UL,_verilogAST::Expression_*,_false> local_a0;
  vector<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
  local_98;
  long *local_80;
  long *local_78;
  long *local_70;
  long *local_68;
  long *local_60;
  vector<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
  *local_58;
  __uniq_ptr_impl<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_> local_50;
  long *local_48;
  pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>
  local_40;
  
  local_60 = *(long **)(*in_RDX + 8);
  *(undefined8 *)(*in_RDX + 8) = 0;
  (*(code *)(((node->_M_t).
              super___uniq_ptr_impl<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>.
              _M_t.
              super__Tuple_impl<0UL,_verilogAST::Vector_*,_std::default_delete<verilogAST::Vector>_>
              .super__Head_base<0UL,_verilogAST::Vector_*,_false>._M_head_impl)->msb)._M_t.
            super___uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>
  )(&local_98);
  ppVar3 = local_98.
           super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_98.
  super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  plVar1 = *(long **)(*in_RDX + 8);
  *(pointer *)(*in_RDX + 8) = ppVar3;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x10))();
    if (local_98.
        super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (*(code *)((local_98.
                  super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->first)._M_t.
                super___uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>
                ._M_t.
                super__Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>
                .super__Head_base<0UL,_verilogAST::Expression_*,_false>._M_head_impl[2].super_Node.
                _vptr_Node)();
    }
  }
  local_98.
  super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (local_60 != (long *)0x0) {
    (**(code **)(*local_60 + 0x10))();
  }
  local_60 = (long *)0x0;
  local_68 = *(long **)(*in_RDX + 0x10);
  *(undefined8 *)(*in_RDX + 0x10) = 0;
  (*(code *)(((node->_M_t).
              super___uniq_ptr_impl<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>.
              _M_t.
              super__Tuple_impl<0UL,_verilogAST::Vector_*,_std::default_delete<verilogAST::Vector>_>
              .super__Head_base<0UL,_verilogAST::Vector_*,_false>._M_head_impl)->super_Node).
            _vptr_Node)(&local_98,node);
  ppVar3 = local_98.
           super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_98.
  super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  plVar1 = *(long **)(*in_RDX + 0x10);
  *(pointer *)(*in_RDX + 0x10) = ppVar3;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x10))();
    if (local_98.
        super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (*(code *)((local_98.
                  super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->first)._M_t.
                super___uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>
                ._M_t.
                super__Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>
                .super__Head_base<0UL,_verilogAST::Expression_*,_false>._M_head_impl[2].super_Node.
                _vptr_Node)();
    }
  }
  local_98.
  super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (local_68 != (long *)0x0) {
    (**(code **)(*local_68 + 0x10))();
  }
  local_68 = (long *)0x0;
  local_70 = *(long **)(*in_RDX + 0x18);
  *(undefined8 *)(*in_RDX + 0x18) = 0;
  (*(code *)(((node->_M_t).
              super___uniq_ptr_impl<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>.
              _M_t.
              super__Tuple_impl<0UL,_verilogAST::Vector_*,_std::default_delete<verilogAST::Vector>_>
              .super__Head_base<0UL,_verilogAST::Vector_*,_false>._M_head_impl)->super_Node).
            _vptr_Node)(&local_98,node);
  ppVar3 = local_98.
           super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_98.
  super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  plVar1 = *(long **)(*in_RDX + 0x18);
  *(pointer *)(*in_RDX + 0x18) = ppVar3;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x10))();
    if (local_98.
        super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (*(code *)((local_98.
                  super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->first)._M_t.
                super___uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>
                ._M_t.
                super__Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>
                .super__Head_base<0UL,_verilogAST::Expression_*,_false>._M_head_impl[2].super_Node.
                _vptr_Node)();
    }
  }
  local_98.
  super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (local_70 != (long *)0x0) {
    (**(code **)(*local_70 + 0x10))();
  }
  local_70 = (long *)0x0;
  lVar5 = *in_RDX;
  if (lVar5 != 0) {
    lVar4 = __dynamic_cast(lVar5,&Vector::typeinfo,&NDVector::typeinfo,0);
    if (lVar4 != 0) {
      local_98.
      super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_98.
      super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98.
      super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_58 = (vector<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
                  *)(lVar4 + 0x20);
      puVar2 = *(undefined8 **)(lVar4 + 0x28);
      local_50._M_t.
      super__Tuple_impl<0UL,_verilogAST::Vector_*,_std::default_delete<verilogAST::Vector>_>.
      super__Head_base<0UL,_verilogAST::Vector_*,_false>._M_head_impl =
           (tuple<verilogAST::Vector_*,_std::default_delete<verilogAST::Vector>_>)
           (tuple<verilogAST::Vector_*,_std::default_delete<verilogAST::Vector>_>)this;
      local_48 = in_RDX;
      for (puVar6 = *(undefined8 **)(lVar4 + 0x20); puVar6 != puVar2; puVar6 = puVar6 + 2) {
        local_78 = (long *)*puVar6;
        *puVar6 = 0;
        (*(code *)(((node->_M_t).
                    super___uniq_ptr_impl<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_verilogAST::Vector_*,_std::default_delete<verilogAST::Vector>_>
                    .super__Head_base<0UL,_verilogAST::Vector_*,_false>._M_head_impl)->super_Node).
                  _vptr_Node)(&local_a0,node,&local_78);
        local_80 = (long *)puVar6[1];
        puVar6[1] = 0;
        (*(code *)(((node->_M_t).
                    super___uniq_ptr_impl<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_verilogAST::Vector_*,_std::default_delete<verilogAST::Vector>_>
                    .super__Head_base<0UL,_verilogAST::Vector_*,_false>._M_head_impl)->super_Node).
                  _vptr_Node)(&local_a8,node,&local_80);
        local_40.first._M_t.
        super___uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>.
        _M_t.
        super__Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>
        .super__Head_base<0UL,_verilogAST::Expression_*,_false>._M_head_impl =
             (__uniq_ptr_data<verilogAST::Expression,_std::default_delete<verilogAST::Expression>,_true,_true>
              )(__uniq_ptr_data<verilogAST::Expression,_std::default_delete<verilogAST::Expression>,_true,_true>
                )local_a0._M_head_impl;
        local_a0._M_head_impl = (Expression *)0x0;
        local_40.second._M_t.
        super___uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>.
        _M_t.
        super__Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>
        .super__Head_base<0UL,_verilogAST::Expression_*,_false>._M_head_impl =
             (__uniq_ptr_data<verilogAST::Expression,_std::default_delete<verilogAST::Expression>,_true,_true>
              )(__uniq_ptr_data<verilogAST::Expression,_std::default_delete<verilogAST::Expression>,_true,_true>
                )local_a8._M_head_impl;
        local_a8._M_head_impl = (Expression *)0x0;
        std::
        vector<std::pair<std::unique_ptr<verilogAST::Expression,std::default_delete<verilogAST::Expression>>,std::unique_ptr<verilogAST::Expression,std::default_delete<verilogAST::Expression>>>,std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,std::default_delete<verilogAST::Expression>>,std::unique_ptr<verilogAST::Expression,std::default_delete<verilogAST::Expression>>>>>
        ::
        emplace_back<std::pair<std::unique_ptr<verilogAST::Expression,std::default_delete<verilogAST::Expression>>,std::unique_ptr<verilogAST::Expression,std::default_delete<verilogAST::Expression>>>>
                  ((vector<std::pair<std::unique_ptr<verilogAST::Expression,std::default_delete<verilogAST::Expression>>,std::unique_ptr<verilogAST::Expression,std::default_delete<verilogAST::Expression>>>,std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,std::default_delete<verilogAST::Expression>>,std::unique_ptr<verilogAST::Expression,std::default_delete<verilogAST::Expression>>>>>
                    *)&local_98,&local_40);
        std::
        pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>
        ::~pair(&local_40);
        if (local_a8._M_head_impl != (Expression *)0x0) {
          (*((local_a8._M_head_impl)->super_Node)._vptr_Node[2])();
        }
        local_a8._M_head_impl = (Expression *)0x0;
        if (local_80 != (long *)0x0) {
          (**(code **)(*local_80 + 0x10))();
        }
        local_80 = (long *)0x0;
        if (local_a0._M_head_impl != (Expression *)0x0) {
          (*((local_a0._M_head_impl)->super_Node)._vptr_Node[2])();
        }
        local_a0._M_head_impl = (Expression *)0x0;
        if (local_78 != (long *)0x0) {
          (**(code **)(*local_78 + 0x10))();
        }
        local_78 = (long *)0x0;
      }
      std::
      vector<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
      ::_M_move_assign(local_58,&local_98);
      std::
      vector<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
      ::~vector(&local_98);
      lVar5 = *local_48;
      this = (Transformer *)
             local_50._M_t.
             super__Tuple_impl<0UL,_verilogAST::Vector_*,_std::default_delete<verilogAST::Vector>_>.
             super__Head_base<0UL,_verilogAST::Vector_*,_false>._M_head_impl;
      in_RDX = local_48;
    }
  }
  *this = (Transformer)lVar5;
  *in_RDX = 0;
  return (__uniq_ptr_data<verilogAST::Vector,_std::default_delete<verilogAST::Vector>,_true,_true>)
         (tuple<verilogAST::Vector_*,_std::default_delete<verilogAST::Vector>_>)this;
}

Assistant:

std::unique_ptr<Vector> Transformer::visit(std::unique_ptr<Vector> node) {
  node->id = this->visit(std::move(node->id));
  node->msb = this->visit(std::move(node->msb));
  node->lsb = this->visit(std::move(node->lsb));
  if (auto ptr = dynamic_cast<NDVector*>(node.get())) {
    std::vector<
        std::pair<std::unique_ptr<Expression>, std::unique_ptr<Expression>>>
        new_outer_dims;
    for (auto& dim : ptr->outer_dims) {
      new_outer_dims.push_back({this->visit(std::move(dim.first)),
                                this->visit(std::move(dim.second))});
    }
    ptr->outer_dims = std::move(new_outer_dims);
  }
  return node;
}